

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_int parseILString(char *originalStr,cl_name_version_khr *ptr,size_t param_value_size,
                    size_t *param_value_size_ret)

{
  char cVar1;
  int iVar2;
  cl_int cVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  
  uVar8 = 0;
  if ((originalStr != (char *)0x0) && (uVar8 = 0, pcVar6 = originalStr, *originalStr != '\0')) {
    do {
      pcVar6 = pcVar6 + -1;
      do {
        cVar1 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
        iVar2 = isspace((int)cVar1);
      } while (iVar2 != 0);
      if (cVar1 != '\0') {
        cVar1 = *pcVar6;
        while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 == 0))) {
          cVar1 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      }
    } while (*pcVar6 != '\0');
    uVar8 = (long)(int)uVar8 * 0x44;
  }
  if (ptr != (cl_name_version_khr *)0x0) {
    cVar3 = -0x1e;
    if (param_value_size < uVar8) goto LAB_00188b88;
    if (originalStr != (char *)0x0) {
      cVar3 = 0;
      if (*originalStr != '\0') {
        do {
          pcVar10 = originalStr + -1;
          pcVar6 = originalStr;
          do {
            pcVar6 = pcVar6 + 1;
            cVar1 = pcVar10[1];
            originalStr = pcVar10 + 1;
            iVar2 = isspace((int)cVar1);
            pcVar10 = originalStr;
          } while (iVar2 != 0);
          if (cVar1 != '\0') {
            ptr->name[0x30] = '\0';
            ptr->name[0x31] = '\0';
            ptr->name[0x32] = '\0';
            ptr->name[0x33] = '\0';
            ptr->name[0x34] = '\0';
            ptr->name[0x35] = '\0';
            ptr->name[0x36] = '\0';
            ptr->name[0x37] = '\0';
            ptr->name[0x38] = '\0';
            ptr->name[0x39] = '\0';
            ptr->name[0x3a] = '\0';
            ptr->name[0x3b] = '\0';
            ptr->name[0x3c] = '\0';
            ptr->name[0x3d] = '\0';
            ptr->name[0x3e] = '\0';
            ptr->name[0x3f] = '\0';
            ptr->name[0x20] = '\0';
            ptr->name[0x21] = '\0';
            ptr->name[0x22] = '\0';
            ptr->name[0x23] = '\0';
            ptr->name[0x24] = '\0';
            ptr->name[0x25] = '\0';
            ptr->name[0x26] = '\0';
            ptr->name[0x27] = '\0';
            ptr->name[0x28] = '\0';
            ptr->name[0x29] = '\0';
            ptr->name[0x2a] = '\0';
            ptr->name[0x2b] = '\0';
            ptr->name[0x2c] = '\0';
            ptr->name[0x2d] = '\0';
            ptr->name[0x2e] = '\0';
            ptr->name[0x2f] = '\0';
            ptr->name[0x10] = '\0';
            ptr->name[0x11] = '\0';
            ptr->name[0x12] = '\0';
            ptr->name[0x13] = '\0';
            ptr->name[0x14] = '\0';
            ptr->name[0x15] = '\0';
            ptr->name[0x16] = '\0';
            ptr->name[0x17] = '\0';
            ptr->name[0x18] = '\0';
            ptr->name[0x19] = '\0';
            ptr->name[0x1a] = '\0';
            ptr->name[0x1b] = '\0';
            ptr->name[0x1c] = '\0';
            ptr->name[0x1d] = '\0';
            ptr->name[0x1e] = '\0';
            ptr->name[0x1f] = '\0';
            ptr->name[0] = '\0';
            ptr->name[1] = '\0';
            ptr->name[2] = '\0';
            ptr->name[3] = '\0';
            ptr->name[4] = '\0';
            ptr->name[5] = '\0';
            ptr->name[6] = '\0';
            ptr->name[7] = '\0';
            ptr->name[8] = '\0';
            ptr->name[9] = '\0';
            ptr->name[10] = '\0';
            ptr->name[0xb] = '\0';
            ptr->name[0xc] = '\0';
            ptr->name[0xd] = '\0';
            ptr->name[0xe] = '\0';
            ptr->name[0xf] = '\0';
            uVar9 = 0;
            while (((cVar1 = pcVar6[-1], cVar1 != '\0' && (cVar1 != '_')) &&
                   (iVar2 = isspace((int)cVar1), iVar2 == 0))) {
              if (uVar9 < 0x40) {
                ptr->name[uVar9] = cVar1;
              }
              uVar9 = uVar9 + 1;
              pcVar6 = pcVar6 + 1;
            }
            ptr->name[0x3f] = '\0';
            originalStr = pcVar6 + -1;
            if (pcVar6[-1] == '_') {
              uVar4 = 0;
              iVar2 = 0;
              cVar1 = *pcVar6;
              while ((int)cVar1 - 0x30U < 10) {
                iVar2 = ((int)cVar1 - 0x30U) + iVar2 * 10;
                cVar1 = pcVar6[1];
                originalStr = pcVar6;
                pcVar6 = pcVar6 + 1;
              }
              pcVar10 = originalStr + 2;
              if (cVar1 != '.') {
                pcVar10 = pcVar6;
              }
              cVar1 = *pcVar10;
              uVar7 = (int)cVar1 - 0x30;
              if (uVar7 < 10) {
                uVar4 = 0;
                do {
                  uVar4 = uVar7 + uVar4 * 10;
                  cVar1 = pcVar10[1];
                  pcVar10 = pcVar10 + 1;
                  uVar7 = (int)cVar1 - 0x30;
                } while (uVar7 < 10);
              }
              originalStr = pcVar10 + (cVar1 == '.');
              uVar7 = (int)pcVar10[cVar1 == '.'] - 0x30;
              if (9 < uVar7) goto LAB_00188b41;
              uVar5 = 0;
              do {
                uVar5 = uVar7 + uVar5 * 10;
                pcVar6 = originalStr + 1;
                originalStr = originalStr + 1;
                uVar7 = (int)*pcVar6 - 0x30;
              } while (uVar7 < 10);
              uVar5 = uVar5 & 0xfff;
            }
            else {
              iVar2 = 0;
              uVar4 = 0;
LAB_00188b41:
              uVar5 = 0;
            }
            ptr->version = (uVar4 & 0x3ff) << 0xc | iVar2 << 0x16 | uVar5;
            cVar1 = *originalStr;
            while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 == 0))) {
              cVar1 = originalStr[1];
              originalStr = originalStr + 1;
            }
            ptr = ptr + 1;
          }
        } while (*originalStr != '\0');
        cVar3 = 0;
      }
      goto LAB_00188b88;
    }
  }
  cVar3 = 0;
LAB_00188b88:
  if (param_value_size_ret != (size_t *)0x0) {
    *param_value_size_ret = uVar8;
  }
  return cVar3;
}

Assistant:

static cl_int parseILString(
    const char* originalStr,
    cl_name_version_khr* ptr,
    size_t param_value_size,
    size_t* param_value_size_ret )
{
    cl_int  errorCode = CL_SUCCESS;

    // Go through the string once to count the number of tokens:
    const char* str = originalStr;
    int     numTokens = 0;
    while( str != NULL && str[0] != '\0' )
    {
        // Skip any preceding spaces
        while( isspace(str[0]) )
        {
            str++;
        }
        if( str[0] != '\0' )
        {
            // Find the next space, or end of string
            size_t  nameSize = 0;
            while( str[0] != '\0' && !isspace(str[0]) )
            {
                str++;
                nameSize++;
            }
            CLI_ASSERT( nameSize < CL_NAME_VERSION_MAX_NAME_SIZE_KHR );
            numTokens++;
        }
    }

    if( ptr != NULL )
    {
        if( param_value_size < numTokens * sizeof(cl_name_version_khr) )
        {
            errorCode = CL_INVALID_VALUE;
        }
        else
        {
            str = originalStr;
            while( str != NULL && str[0] != '\0' )
            {
                // skip any preceding spaces
                while( isspace(str[0]) )
                {
                    str++;
                }
                if( str[0] != '\0' )
                {
                    memset(ptr->name, 0, sizeof(ptr->name));

                    // find the next space, underscore, or end of string
                    size_t  nameSize = 0;
                    while( str[0] != '\0' && str[0] != '_' && !isspace(str[0]) )
                    {
                        if( nameSize < sizeof(ptr->name) )
                        {
                            ptr->name[nameSize] = str[0];
                        }
                        str++;
                        nameSize++;
                    }
                    ptr->name[sizeof(ptr->name) - 1] = '\0';

                    // version
                    cl_uint major = 0;
                    cl_uint minor = 0;
                    cl_uint patch = 0;
                    if( str[0] == '_' )
                    {
                        str++;
                        while( isdigit(str[0]) )
                        {
                            major *= 10;
                            major += str[0] - '0';
                            str++;
                        }
                        if( str[0] == '.' )
                        {
                            str++;
                        }
                        while( isdigit(str[0]) )
                        {
                            minor *= 10;
                            minor += str[0] - '0';
                            str++;
                        }
                        if( str[0] == '.' )
                        {
                            str++;
                        }
                        while( isdigit(str[0]) )
                        {
                            patch *= 10;
                            patch += str[0] - '0';
                            str++;
                        }
                    }
                    ptr->version = CL_MAKE_VERSION_KHR( major, minor, patch );

                    // find the next space or end of string
                    while( str[0] != '\0' && !isspace(str[0]) )
                    {
                        str++;
                    }

                    ptr++;
                }
            }
        }
    }
    if( param_value_size_ret != NULL )
    {
        *param_value_size_ret = numTokens * sizeof(cl_name_version_khr);
    }

    return errorCode;
}